

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

bool_t prf_header_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int8_t iVar1;
  uint16_t uVar2;
  ushort uVar3;
  int16_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  void *pvVar7;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  uint8_t *puVar8;
  float64_t fVar9;
  _func_int_float_void_ptr *p_Var10;
  char *pcVar11;
  bfile_t *unaff_retaddr;
  node_data_conflict3 *data;
  uint16_t pos;
  bfile_t *in_stack_ffffffffffffffc8;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  uint uVar12;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar13;
  
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar2;
  if (*in_RDI == prf_header_info.opcode) {
    uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar2;
    uVar12 = CONCAT22(4,(short)in_stack_ffffffffffffffdc);
    if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar7 = malloc((long)(int)(in_RDI[1] - 4) + 6);
        *(void **)(in_RDI + 4) = pvVar7;
      }
      else {
        pvVar7 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar7;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,uVar12);
        return 0;
      }
    }
    uVar3 = (ushort)(uVar12 >> 0x10);
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if ((uVar12 >> 0x10) + 8 <= (uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
      uVar3 = uVar3 + 8;
      if (uVar3 + 4 <= (uint)in_RDI[1]) {
        iVar5 = bf_get_int32_be(bfile_00);
        *(int32_t *)&bfile_00->file = iVar5;
        uVar3 = uVar3 + 4;
        if (uVar3 + 4 <= (uint)in_RDI[1]) {
          iVar5 = bf_get_int32_be(bfile_00);
          *(int32_t *)((long)&bfile_00->file + 4) = iVar5;
          uVar3 = uVar3 + 4;
          if (uVar3 + 0x20 <= (uint)in_RDI[1]) {
            bf_read(unaff_retaddr,
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (uint)((ulong)in_RDI >> 0x20));
            uVar3 = uVar3 + 0x20;
            if (uVar3 + 2 <= (uint)in_RDI[1]) {
              iVar4 = bf_get_int16_be(bfile_00);
              *(int16_t *)&bfile_00->buffer = iVar4;
              uVar3 = uVar3 + 2;
              if (uVar3 + 2 <= (uint)in_RDI[1]) {
                iVar4 = bf_get_int16_be(bfile_00);
                *(int16_t *)((long)&bfile_00->buffer + 2) = iVar4;
                uVar3 = uVar3 + 2;
                if (uVar3 + 2 <= (uint)in_RDI[1]) {
                  iVar4 = bf_get_int16_be(bfile_00);
                  *(int16_t *)((long)&bfile_00->buffer + 4) = iVar4;
                  uVar3 = uVar3 + 2;
                  if (uVar3 + 2 <= (uint)in_RDI[1]) {
                    iVar4 = bf_get_int16_be(bfile_00);
                    *(int16_t *)((long)&bfile_00->buffer + 6) = iVar4;
                    uVar3 = uVar3 + 2;
                    if (uVar3 + 2 <= (uint)in_RDI[1]) {
                      iVar4 = bf_get_int16_be(bfile_00);
                      *(int16_t *)&bfile_00->buffer_size = iVar4;
                      uVar3 = uVar3 + 2;
                      if (uVar3 + 1 <= (uint)in_RDI[1]) {
                        iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
                        *(int8_t *)((long)&bfile_00->buffer_size + 2) = iVar1;
                        uVar3 = uVar3 + 1;
                        if (uVar3 + 1 <= (uint)in_RDI[1]) {
                          iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
                          *(int8_t *)((long)&bfile_00->buffer_size + 3) = iVar1;
                          uVar3 = uVar3 + 1;
                          if (uVar3 + 4 <= (uint)in_RDI[1]) {
                            uVar6 = bf_get_uint32_be(bfile_00);
                            *(uint32_t *)&bfile_00->field_0x3c = uVar6;
                            uVar3 = uVar3 + 4;
                            if (uVar3 + 4 <= (uint)in_RDI[1]) {
                              iVar5 = bf_get_int32_be(bfile_00);
                              *(int32_t *)&bfile_00->progress_cb = iVar5;
                              uVar3 = uVar3 + 4;
                              if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                iVar5 = bf_get_int32_be(bfile_00);
                                *(int32_t *)((long)&bfile_00->progress_cb + 4) = iVar5;
                                uVar3 = uVar3 + 4;
                                if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                  iVar5 = bf_get_int32_be(bfile_00);
                                  *(int32_t *)&bfile_00->progress_data = iVar5;
                                  uVar3 = uVar3 + 4;
                                  if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                    iVar5 = bf_get_int32_be(bfile_00);
                                    *(int32_t *)((long)&bfile_00->progress_data + 4) = iVar5;
                                    uVar3 = uVar3 + 4;
                                    if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                      iVar5 = bf_get_int32_be(bfile_00);
                                      *(int32_t *)(bfile_00 + 1) = iVar5;
                                      uVar3 = uVar3 + 4;
                                      if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                        iVar5 = bf_get_int32_be(bfile_00);
                                        *(int32_t *)&bfile_00[1].field_0x4 = iVar5;
                                        uVar3 = uVar3 + 4;
                                        if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                          iVar5 = bf_get_int32_be(bfile_00);
                                          *(int32_t *)&bfile_00[1].file = iVar5;
                                          uVar3 = uVar3 + 4;
                                          if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                            iVar5 = bf_get_int32_be(bfile_00);
                                            *(int32_t *)((long)&bfile_00[1].file + 4) = iVar5;
                                            uVar3 = uVar3 + 4;
                                            if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                              iVar5 = bf_get_int32_be(bfile_00);
                                              *(int32_t *)&bfile_00[1].size = iVar5;
                                              uVar3 = uVar3 + 4;
                                              if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                iVar5 = bf_get_int32_be(bfile_00);
                                                *(int32_t *)((long)&bfile_00[1].size + 4) = iVar5;
                                                uVar3 = uVar3 + 4;
                                                if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                  iVar5 = bf_get_int32_be(bfile_00);
                                                  *(int32_t *)&bfile_00[1].pos = iVar5;
                                                  uVar3 = uVar3 + 4;
                                                  if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                    iVar5 = bf_get_int32_be(bfile_00);
                                                    *(int32_t *)((long)&bfile_00[1].pos + 4) = iVar5
                                                    ;
                                                    uVar3 = uVar3 + 4;
                                                    if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                      iVar5 = bf_get_int32_be(bfile_00);
                                                      *(int32_t *)&bfile_00[1].ipos = iVar5;
                                                      uVar3 = uVar3 + 4;
                                                      if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                        iVar5 = bf_get_int32_be(bfile_00);
                                                        *(int32_t *)((long)&bfile_00[1].ipos + 4) =
                                                             iVar5;
                                                        uVar3 = uVar3 + 4;
                                                        if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                          iVar4 = bf_get_int16_be(bfile_00);
                                                          *(int16_t *)&bfile_00[1].filename = iVar4;
                                                          uVar3 = uVar3 + 2;
                                                          if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                            iVar4 = bf_get_int16_be(bfile_00);
                                                            *(int16_t *)
                                                             ((long)&bfile_00[1].filename + 2) =
                                                                 iVar4;
                                                            uVar12 = (uint)(ushort)(uVar3 + 2) <<
                                                                     0x10;
                                                            if (*(short *)((long)&bfile_00[1].
                                                                                  filename + 2) != 1
                                                               ) {
                                                              prf_warn(3,
                                                  "vertex storage type (%d) may not be supported\n",
                                                  (ulong)(uint)(int)*(short *)((long)&bfile_00[1].
                                                                                      filename + 2))
                                                  ;
                                                  }
                                                  uVar3 = (ushort)(uVar12 >> 0x10);
                                                  if ((uVar12 >> 0x10) + 4 <= (uint)in_RDI[1]) {
                                                    iVar5 = bf_get_int32_be(bfile_00);
                                                    *(int32_t *)((long)&bfile_00[1].filename + 4) =
                                                         iVar5;
                                                    uVar3 = uVar3 + 4;
                                                    if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                      puVar8 = (uint8_t *)
                                                               bf_get_float64_be(bfile_00);
                                                      bfile_00[1].buffer = puVar8;
                                                      uVar3 = uVar3 + 8;
                                                      if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                        fVar9 = bf_get_float64_be(bfile_00);
                                                        *(float64_t *)&bfile_00[1].buffer_size =
                                                             fVar9;
                                                        uVar3 = uVar3 + 8;
                                                        if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                          p_Var10 = (_func_int_float_void_ptr *)
                                                                    bf_get_float64_be(bfile_00);
                                                          bfile_00[1].progress_cb = p_Var10;
                                                          uVar3 = uVar3 + 8;
                                                          if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                            pvVar7 = (void *)bf_get_float64_be(
                                                  bfile_00);
                                                  bfile_00[1].progress_data = pvVar7;
                                                  uVar3 = uVar3 + 8;
                                                  if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                    uVar2 = bf_get_int16_be(bfile_00);
                                                    bfile_00[2].flags = uVar2;
                                                    uVar3 = uVar3 + 2;
                                                    if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                      iVar4 = bf_get_int16_be(bfile_00);
                                                      *(int16_t *)&bfile_00[2].field_0x2 = iVar4;
                                                      uVar3 = uVar3 + 2;
                                                      if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                        iVar5 = bf_get_int32_be(bfile_00);
                                                        *(int32_t *)&bfile_00[2].field_0x4 = iVar5;
                                                        uVar3 = uVar3 + 4;
                                                        if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                          iVar5 = bf_get_int32_be(bfile_00);
                                                          *(int32_t *)&bfile_00[2].file = iVar5;
                                                          uVar3 = uVar3 + 4;
                                                          if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                            iVar4 = bf_get_int16_be(bfile_00);
                                                            *(int16_t *)
                                                             ((long)&bfile_00[2].file + 4) = iVar4;
                                                            uVar3 = uVar3 + 2;
                                                            if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                              iVar4 = bf_get_int16_be(bfile_00);
                                                              *(int16_t *)
                                                               ((long)&bfile_00[2].file + 6) = iVar4
                                                              ;
                                                              uVar3 = uVar3 + 2;
                                                              if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                                iVar4 = bf_get_int16_be(bfile_00);
                                                                *(int16_t *)&bfile_00[2].size =
                                                                     iVar4;
                                                                uVar3 = uVar3 + 2;
                                                                if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                                  iVar4 = bf_get_int16_be(bfile_00);
                                                                  *(int16_t *)
                                                                   ((long)&bfile_00[2].size + 2) =
                                                                       iVar4;
                                                                  uVar3 = uVar3 + 2;
                                                                  if (uVar3 + 4 <= (uint)in_RDI[1])
                                                                  {
                                                                    iVar5 = bf_get_int32_be(bfile_00
                                                  );
                                                  *(int32_t *)((long)&bfile_00[2].size + 4) = iVar5;
                                                  uVar3 = uVar3 + 4;
                                                  if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                    fVar9 = bf_get_float64_be(bfile_00);
                                                    bfile_00[2].pos = (size_t)fVar9;
                                                    uVar3 = uVar3 + 8;
                                                    if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                      fVar9 = bf_get_float64_be(bfile_00);
                                                      bfile_00[2].ipos = (size_t)fVar9;
                                                      uVar3 = uVar3 + 8;
                                                      if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                        pcVar11 = (char *)bf_get_float64_be(bfile_00
                                                  );
                                                  bfile_00[2].filename = pcVar11;
                                                  uVar3 = uVar3 + 8;
                                                  if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                    puVar8 = (uint8_t *)bf_get_float64_be(bfile_00);
                                                    bfile_00[2].buffer = puVar8;
                                                    uVar3 = uVar3 + 8;
                                                    if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                      fVar9 = bf_get_float64_be(bfile_00);
                                                      *(float64_t *)&bfile_00[2].buffer_size = fVar9
                                                      ;
                                                      uVar3 = uVar3 + 8;
                                                      if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                        p_Var10 = (_func_int_float_void_ptr *)
                                                                  bf_get_float64_be(bfile_00);
                                                        bfile_00[2].progress_cb = p_Var10;
                                                        uVar3 = uVar3 + 8;
                                                        if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                          pvVar7 = (void *)bf_get_float64_be(
                                                  bfile_00);
                                                  bfile_00[2].progress_data = pvVar7;
                                                  uVar3 = uVar3 + 8;
                                                  if (uVar3 + 8 <= (uint)in_RDI[1]) {
                                                    fVar9 = bf_get_float64_be(bfile_00);
                                                    *(float64_t *)(bfile_00 + 3) = fVar9;
                                                    uVar3 = uVar3 + 8;
                                                    if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                      iVar4 = bf_get_int16_be(bfile_00);
                                                      *(int16_t *)&bfile_00[3].file = iVar4;
                                                      uVar3 = uVar3 + 2;
                                                      if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                        iVar4 = bf_get_int16_be(bfile_00);
                                                        *(int16_t *)((long)&bfile_00[3].file + 2) =
                                                             iVar4;
                                                        uVar3 = uVar3 + 2;
                                                        if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                          iVar4 = bf_get_int16_be(bfile_00);
                                                          *(int16_t *)((long)&bfile_00[3].file + 4)
                                                               = iVar4;
                                                          uVar3 = uVar3 + 2;
                                                          if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                            iVar4 = bf_get_int16_be(bfile_00);
                                                            *(int16_t *)
                                                             ((long)&bfile_00[3].file + 6) = iVar4;
                                                            uVar3 = uVar3 + 2;
                                                            if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                              iVar4 = bf_get_int16_be(bfile_00);
                                                              *(int16_t *)&bfile_00[3].size = iVar4;
                                                              uVar3 = uVar3 + 2;
                                                              if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                                iVar4 = bf_get_int16_be(bfile_00);
                                                                *(int16_t *)
                                                                 ((long)&bfile_00[3].size + 2) =
                                                                     iVar4;
                                                                uVar3 = uVar3 + 2;
                                                                if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                                  iVar4 = bf_get_int16_be(bfile_00);
                                                                  *(int16_t *)
                                                                   ((long)&bfile_00[3].size + 4) =
                                                                       iVar4;
                                                                  uVar3 = uVar3 + 2;
                                                                  if (uVar3 + 2 <= (uint)in_RDI[1])
                                                                  {
                                                                    iVar4 = bf_get_int16_be(bfile_00
                                                  );
                                                  *(int16_t *)((long)&bfile_00[3].size + 6) = iVar4;
                                                  uVar3 = uVar3 + 2;
                                                  if (uVar3 + 4 <= (uint)in_RDI[1]) {
                                                    iVar5 = bf_get_int32_be(bfile_00);
                                                    *(int32_t *)&bfile_00[3].pos = iVar5;
                                                    uVar3 = uVar3 + 4;
                                                    if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                      iVar4 = bf_get_int16_be(bfile_00);
                                                      *(int16_t *)((long)&bfile_00[3].pos + 4) =
                                                           iVar4;
                                                      uVar3 = uVar3 + 2;
                                                      if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                        iVar4 = bf_get_int16_be(bfile_00);
                                                        *(int16_t *)((long)&bfile_00[3].pos + 6) =
                                                             iVar4;
                                                        uVar3 = uVar3 + 2;
                                                        if (uVar3 + 2 <= (uint)in_RDI[1]) {
                                                          iVar4 = bf_get_int16_be(bfile_00);
                                                          *(int16_t *)&bfile_00[3].ipos = iVar4;
                                                          uVar3 = uVar3 + 2;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (uVar3 < in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar13 = 1;
  }
  else {
    prf_error(9,"tried header load method for node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar13 = 0;
  }
  return bVar13;
}

Assistant:

static
bool_t
prf_header_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint16_t pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    pos = 4;

    if ( (node->length > 4) && (node->data == NULL) ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_read( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->format_revision_level = bf_get_int32_be( bfile ); pos += 4;
/*
        fprintf( stderr, "Open Flight revision level: %d\n",
            data->format_revision_level );
*/
        if ( node->length < (pos + 4) ) break;
        data->edit_revision_level = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_read( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        data->next_group = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_lod = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_object = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_face = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->unit_multiplier_divisor = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        data->vertex_coordinate_units = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->texwhite = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved1[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->projection_type = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[2] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[3] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[4] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[5] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved2[6] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_dof = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->vertex_storage_type = bf_get_int16_be( bfile ); pos += 2;
        if ( data->vertex_storage_type != 1 ) {
            prf_warn( 3, "vertex storage type (%d) may not be supported\n",
                data->vertex_storage_type );
            /* bf_rewind( bfile, pos ); return FALSE; */
        }
        if ( node->length < (pos + 4) ) break;
        data->database_origin = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_x, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_database_y, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_x, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->delta_y, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_sound = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_path = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[0] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->reserved3[1] = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_clip = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_text = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_bsp = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_switch = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->southwest_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->northeast_corner_longitude,
            bf_get_float64_be( bfile )); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_latitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->origin_longitude, bf_get_float64_be( bfile ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_upper_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblwrite( data->lambert_lower_latitude,
            bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        data->next_light_source = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_light_point = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_road = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_cat = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved8 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->earth_ellipsoid_model = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->next_adaptive = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->next_curve = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved9 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}